

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O0

void __thiscall QPixmap::setDevicePixelRatio(QPixmap *this,qreal scaleFactor)

{
  bool bVar1;
  QPlatformPixmap *pQVar2;
  QPixmap *in_XMM0_Qa;
  double extraout_XMM0_Qa;
  QPixmap *in_stack_ffffffffffffffe0;
  QPixmap *this_00;
  
  bVar1 = isNull(in_stack_ffffffffffffffe0);
  if (!bVar1) {
    this_00 = in_XMM0_Qa;
    pQVar2 = QExplicitlySharedDataPointer<QPlatformPixmap>::operator->
                       ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x321894);
    (*pQVar2->_vptr_QPlatformPixmap[0x14])();
    if (((double)in_XMM0_Qa != extraout_XMM0_Qa) ||
       (NAN((double)in_XMM0_Qa) || NAN(extraout_XMM0_Qa))) {
      detach(this_00);
      pQVar2 = QExplicitlySharedDataPointer<QPlatformPixmap>::operator->
                         ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x3218cb);
      (*pQVar2->_vptr_QPlatformPixmap[0x15])(this_00);
    }
  }
  return;
}

Assistant:

void QPixmap::setDevicePixelRatio(qreal scaleFactor)
{
    if (isNull())
        return;

    if (scaleFactor == data->devicePixelRatio())
        return;

    detach();
    data->setDevicePixelRatio(scaleFactor);
}